

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bareNEST.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  pointer *this;
  value_type vVar1;
  value_type vVar2;
  bool bVar3;
  pointer rho_00;
  int iVar4;
  ostream *poVar5;
  VDetector *detector_00;
  RandomGen *pRVar6;
  reference pvVar7;
  vector<double,_std::allocator<double>_> *pvVar8;
  pointer *ppdVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  double extraout_XMM0_Qa_01;
  double extraout_XMM0_Qa_02;
  double extraout_XMM0_Qa_03;
  double extraout_XMM0_Qa_04;
  double local_17f0;
  double Ne;
  double g1;
  double Nph;
  vector<double,_std::allocator<double>_> scint2;
  vector<double,_std::allocator<double>_> scint;
  double smearPos [3];
  double truthPos [3];
  undefined1 local_1768 [8];
  vector<long,_std::allocator<long>_> wf_time;
  vector<double,_std::allocator<double>_> wf_amp;
  double Nphd_S2;
  undefined1 auStack_1728 [16];
  double dStack_1718;
  YieldResult local_1710;
  vector<double,_std::allocator<double>_> local_16e0;
  undefined1 local_16c8 [8];
  vector<double,_std::allocator<double>_> g2_params;
  double rho;
  double local_9f8;
  double keV;
  TestSpectra spec;
  INTERACTION_TYPE type_num;
  double wimp_mass_GeV;
  double massNum;
  double atomNum;
  double eMax;
  double eMin;
  double vD_middle;
  double vD;
  double field;
  double driftTime;
  double phi;
  double r;
  double pos_z;
  double pos_y;
  double pos_x;
  double g2;
  undefined1 local_310 [4];
  int index;
  vector<double,_std::allocator<double>_> vTable;
  QuantaResult quanta;
  YieldResult yields;
  NESTcalc n;
  DetectorExample_LUX_RUN03 *detector;
  double dayNum;
  char **argv_local;
  int argc_local;
  
  poVar5 = std::operator<<((ostream *)&std::cerr,
                           "NOTE: This is a skeleton code meant to be a starting point for custom uses of NEST. But you should really look at execNEST."
                          );
  poVar5 = (ostream *)std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  std::ostream::operator<<(poVar5,std::endl<char,std::char_traits<char>>);
  detector_00 = (VDetector *)operator_new(0x128);
  DetectorExample_LUX_RUN03::DetectorExample_LUX_RUN03((DetectorExample_LUX_RUN03 *)detector_00);
  NEST::NESTcalc::NESTcalc((NESTcalc *)&yields.DeltaT_Scint,detector_00);
  pRVar6 = RandomGen::rndm();
  RandomGen::SetSeed(pRVar6,0);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_310);
  spec.wimp_spectrum_prep.divisor._4_4_ = NR;
  TestSpectra::TestSpectra((TestSpectra *)&keV);
  if (spec.wimp_spectrum_prep.divisor._4_4_ - WIMP < 10) {
    iVar4 = (*(code *)(&DAT_0012a320 +
                      *(int *)(&DAT_0012a320 +
                              (ulong)(spec.wimp_spectrum_prep.divisor._4_4_ - WIMP) * 4)))();
    return iVar4;
  }
  pRVar6 = RandomGen::rndm();
  dVar10 = RandomGen::rand_uniform(pRVar6);
  local_9f8 = dVar10 * 90.0 + 10.0;
  if ((spec.wimp_spectrum_prep.divisor._4_4_ != WIMP) &&
     (spec.wimp_spectrum_prep.divisor._4_4_ != B8)) {
    if (100.0 < local_9f8) {
      local_9f8 = 100.0;
    }
    if (local_9f8 < 10.0) {
      local_9f8 = 10.0;
    }
  }
  dVar10 = VDetector::get_T_Kelvin(detector_00);
  dVar11 = VDetector::get_p_bar(detector_00);
  g2_params.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage =
       (pointer)NEST::NESTcalc::SetDensity((NESTcalc *)&yields.DeltaT_Scint,dVar10,dVar11);
  if ((double)g2_params.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage < 1.0) {
    VDetector::set_inGas(detector_00,true);
  }
  NEST::NESTcalc::CalculateG2
            ((vector<double,_std::allocator<double>_> *)local_16c8,(NESTcalc *)&yields.DeltaT_Scint,
             1);
  pvVar7 = std::vector<double,_std::allocator<double>_>::back
                     ((vector<double,_std::allocator<double>_> *)local_16c8);
  rho_00 = g2_params.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  dVar10 = z_step;
  local_17f0 = *pvVar7;
  dVar11 = VDetector::get_T_Kelvin(detector_00);
  dVar12 = VDetector::get_p_bar(detector_00);
  NEST::NESTcalc::SetDriftVelocity_NonUniform
            (&local_16e0,(NESTcalc *)&yields.DeltaT_Scint,(double)rho_00,dVar10,dVar11,dVar12,pos_y,
             pos_z);
  std::vector<double,_std::allocator<double>_>::operator=
            ((vector<double,_std::allocator<double>_> *)local_310,&local_16e0);
  std::vector<double,_std::allocator<double>_>::~vector(&local_16e0);
  dVar10 = VDetector::get_gate(detector_00);
  dVar11 = VDetector::get_cathode(detector_00);
  dVar10 = floor(((dVar10 + -100.0 + dVar11 + 1.5) * 0.5) / z_step + 0.5);
  pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_310,(long)(int)dVar10);
  dVar10 = *pvVar7;
  field = -999.0;
  while( true ) {
    dVar11 = VDetector::get_dt_min(detector_00);
    bVar3 = true;
    if (dVar11 <= field) {
      dVar11 = VDetector::get_dt_max(detector_00);
      bVar3 = true;
      if ((field <= dVar11) && (bVar3 = true, 0.0 < r)) {
        dVar11 = VDetector::get_TopDrift(detector_00);
        bVar3 = dVar11 < r;
      }
    }
    if (!bVar3) break;
    dVar11 = VDetector::get_TopDrift(detector_00);
    pRVar6 = RandomGen::rndm();
    dVar12 = RandomGen::rand_uniform(pRVar6);
    r = dVar11 * dVar12 + 0.0;
    dVar11 = VDetector::get_radius(detector_00);
    pRVar6 = RandomGen::rndm();
    dVar12 = RandomGen::rand_uniform(pRVar6);
    dVar12 = sqrt(dVar12);
    pRVar6 = RandomGen::rndm();
    dVar13 = RandomGen::rand_uniform(pRVar6);
    dVar14 = cos(dVar13 * 6.283185307179586);
    pos_y = dVar11 * dVar12 * dVar14;
    dVar13 = sin(dVar13 * 6.283185307179586);
    pos_z = dVar11 * dVar12 * dVar13;
    (*detector_00->_vptr_VDetector[4])(pos_y,SUB84(pos_z,0),SUB84(r,0));
    dVar11 = floor(r / z_step + 0.5);
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_310,(long)(int)dVar11);
    vD_middle = *pvVar7;
    dVar11 = VDetector::get_TopDrift(detector_00);
    field = (dVar11 - r) / vD_middle;
    vD = extraout_XMM0_Qa;
  }
  NEST::NESTcalc::GetYields
            (&local_1710,(NESTcalc *)&yields.DeltaT_Scint,spec.wimp_spectrum_prep.divisor._4_4_,
             local_9f8,
             (double)g2_params.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,vD,0.0,0.0,&default_NRYieldsParam,
             &default_ERYieldsParam);
  yields.Lindhard = local_1710.ElectricField;
  yields.ElectricField = local_1710.DeltaT_Scint;
  yields.ElectronYield = local_1710.ExcitonRatio;
  yields.ExcitonRatio = local_1710.Lindhard;
  quanta.Variance = local_1710.PhotonYield;
  yields.PhotonYield = local_1710.ElectronYield;
  NEST::NESTcalc::GetQuanta
            ((QuantaResult *)&Nphd_S2,(NESTcalc *)&yields.DeltaT_Scint,
             (YieldResult *)&quanta.Variance,
             (double)g2_params.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,&default_NRERWidthsParam,-999.0);
  quanta.ions = auStack_1728._8_4_;
  quanta.excitons = auStack_1728._12_4_;
  quanta.recombProb = dStack_1718;
  vTable.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)Nphd_S2;
  quanta.photons = auStack_1728._0_4_;
  quanta.electrons = auStack_1728._4_4_;
  dVar11 = VDetector::get_eLife_us(detector_00);
  exp(-field / dVar11);
  this = &wf_time.super__Vector_base<long,_std::allocator<long>_>._M_impl.super__Vector_impl_data.
          _M_end_of_storage;
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)this);
  std::vector<long,_std::allocator<long>_>::vector
            ((vector<long,_std::allocator<long>_> *)local_1768);
  pvVar8 = NEST::NESTcalc::GetS1
                     ((NESTcalc *)&yields.DeltaT_Scint,
                      (QuantaResult *)
                      &vTable.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,pos_y,pos_z,r,pos_y,pos_z,r,
                      vD_middle,dVar10,spec.wimp_spectrum_prep.divisor._4_4_,0,vD,local_9f8,
                      s1CalculationMode,verbosity,(vector<long,_std::allocator<long>_> *)local_1768,
                      (vector<double,_std::allocator<double>_> *)this);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)
             &scint2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,pvVar8);
  dVar10 = VDetector::get_cathode(detector_00);
  if (r < dVar10) {
    vTable.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)((ulong)vTable.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage & 0xffffffff);
  }
  pvVar8 = NEST::NESTcalc::GetS2
                     ((NESTcalc *)&yields.DeltaT_Scint,
                      vTable.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage._4_4_,pos_y,pos_z,r,pos_y,pos_z,r,
                      field,vD_middle,0,vD,s2CalculationMode,verbosity,
                      (vector<long,_std::allocator<long>_> *)local_1768,
                      (vector<double,_std::allocator<double>_> *)
                      &wf_time.super__Vector_base<long,_std::allocator<long>_>._M_impl.
                       super__Vector_impl_data._M_end_of_storage,
                      (vector<double,_std::allocator<double>_> *)local_16c8);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&Nph,pvVar8);
  if ((MCtruthE & 1U) == 0) {
    dVar10 = VDetector::get_g1(detector_00);
    if (usePD == 0) {
      ppdVar9 = &scint2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
      std::vector<double,_std::allocator<double>_>::operator[]
                ((vector<double,_std::allocator<double>_> *)ppdVar9,3);
      std::abs((int)ppdVar9);
      dVar11 = VDetector::get_P_dphe(detector_00);
      g1 = extraout_XMM0_Qa_00 / (dVar10 * (dVar11 + 1.0));
    }
    else {
      if (usePD == 1) {
        ppdVar9 = &scint2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)ppdVar9,5);
        std::abs((int)ppdVar9);
        dVar11 = extraout_XMM0_Qa_01;
      }
      else {
        ppdVar9 = &scint2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                   super__Vector_impl_data._M_end_of_storage;
        std::vector<double,_std::allocator<double>_>::operator[]
                  ((vector<double,_std::allocator<double>_> *)ppdVar9,7);
        std::abs((int)ppdVar9);
        dVar11 = extraout_XMM0_Qa_02;
      }
      g1 = dVar11 / dVar10;
    }
    if (usePD == 0) {
      pvVar8 = (vector<double,_std::allocator<double>_> *)&Nph;
      std::vector<double,_std::allocator<double>_>::operator[](pvVar8,5);
      std::abs((int)pvVar8);
      dVar10 = VDetector::get_P_dphe(detector_00);
      local_17f0 = extraout_XMM0_Qa_03 / (local_17f0 * (dVar10 + 1.0));
    }
    else {
      pvVar8 = (vector<double,_std::allocator<double>_> *)&Nph;
      std::vector<double,_std::allocator<double>_>::operator[](pvVar8,7);
      std::abs((int)pvVar8);
      local_17f0 = extraout_XMM0_Qa_04 / local_17f0;
    }
    if (((yields.ExcitonRatio <= 2.2250738585072014e-308) || (g1 <= 0.0)) || (local_17f0 <= 0.0)) {
      local_9f8 = 0.0;
    }
    else {
      local_9f8 = ((g1 + local_17f0) * 13.4 * 0.001) / yields.ExcitonRatio;
    }
  }
  fprintf(_stdout,
          "\nE [keV]\t\tfield [V/cm]\ttDrift [us]\tX,Y,Z [mm]\tNph\tNe-\tS1 [PE or phe]\tS1_3Dcor [phd]\tS1c_spike\tNe-Extr\tS2_rawArea [PE]\tS2_3Dcorr [phd]\n"
         );
  printf("%.6f\t%.6f\t%.6f\t%.0f, %.0f, %.0f\t%d\t%d\t",local_9f8,SUB84(vD,0),SUB84(field,0),pos_y,
         pos_z,r,(ulong)vTable.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_end_of_storage & 0xffffffff,
         (ulong)vTable.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_end_of_storage >> 0x20);
  if (((1000.0 < local_9f8) ||
      (pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                          ((vector<double,_std::allocator<double>_> *)
                           &scint2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage,5), maxS1 < *pvVar7)) ||
     (pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)&Nph,7), maxS2 < *pvVar7)) {
    ppdVar9 = &scint2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)ppdVar9,2);
    vVar1 = *pvVar7;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)ppdVar9,5);
    vVar2 = *pvVar7;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)ppdVar9,7);
    printf("%e\t%e\t%e\t",vVar1,SUB84(vVar2,0),SUB84(*pvVar7,0));
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)&Nph,0);
    dVar10 = *pvVar7;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)&Nph,4);
    vVar1 = *pvVar7;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)&Nph,7);
    printf("%lli\t%e\t%e\n",vVar1,SUB84(*pvVar7,0),(long)dVar10);
  }
  else {
    ppdVar9 = &scint2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)ppdVar9,2);
    vVar1 = *pvVar7;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)ppdVar9,5);
    vVar2 = *pvVar7;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)ppdVar9,7);
    printf("%.6f\t%.6f\t%.6f\t",vVar1,SUB84(vVar2,0),SUB84(*pvVar7,0));
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)&Nph,0);
    dVar10 = *pvVar7;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)&Nph,4);
    vVar1 = *pvVar7;
    pvVar7 = std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)&Nph,7);
    printf("%i\t%.6f\t%.6f\n",vVar1,SUB84(*pvVar7,0),(ulong)(uint)(int)dVar10);
  }
  spec.wimp_spectrum_prep.divisor._0_4_ = 1;
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&Nph);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             &scint2.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<long,_std::allocator<long>_>::~vector
            ((vector<long,_std::allocator<long>_> *)local_1768);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)
             &wf_time.super__Vector_base<long,_std::allocator<long>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_16c8);
  std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_310);
  NEST::NESTcalc::~NESTcalc((NESTcalc *)&yields.DeltaT_Scint);
  return 0;
}

Assistant:

int main(int argc, char** argv) {
  double dayNum = 0.;
  // Give a message establishing the use of this code
  cerr << "NOTE: This is a skeleton code meant to be a starting point for "
          "custom uses of NEST. But you should really look at execNEST."
       << endl
       << endl;

  // Instantiate your own VDetector class here, then load into NEST class
  // constructor
  DetectorExample_LUX_RUN03* detector = new DetectorExample_LUX_RUN03();

  // Construct NEST class using detector object
  NEST::NESTcalc n(detector);

  // Set random seed of RandomGen class
  RandomGen::rndm()->SetSeed(0);

  // Construct NEST objects for storing calculation results
  NEST::YieldResult yields;
  NEST::QuantaResult quanta;

  // Declare needed temporary variables
  vector<double> vTable;
  int index;  // index for Z step (for getting pre-calculated drift field)
  double g2, pos_x, pos_y, pos_z, r, phi, driftTime, field, vD, vD_middle;
  // Energy min and max for source spectrum
  double eMin = 10;
  double eMax = 100;
  // For ion calculations
  double atomNum = 0, massNum = 0;
  // Only necessary for type_num == WIMP
  double wimp_mass_GeV = 1.;

  // Choose a possible interaction type
  INTERACTION_TYPE type_num = NR;
  // INTERACTION_TYPE type_num = WIMP;
  // INTERACTION_TYPE type_num = B8;
  // INTERACTION_TYPE type_num = DD;
  // INTERACTION_TYPE type_num = AmBe;
  // INTERACTION_TYPE type_num = Cf;
  // NOTE: For heavy nuclei or ions, ion requires specification of "atomNum" and
  // "massNum"
  // INTERACTION_TYPE type_num = ion;
  // INTERACTION_TYPE type_num = gammaRay;
  // INTERACTION_TYPE type_num = Kr83m;
  // INTERACTION_TYPE type_num = CH3T;
  // INTERACTION_TYPE type_num = C14;
  // INTERACTION_TYPE type_num = NEST::beta;

  // Do checks for special-case source spectra
  if (type_num == Kr83m) {
    if (eMin == 9.4 && eMax == 9.4) {
    } else if (eMin == 32.1 && eMax == 32.1) {
    } else {
      if (verbosity > 0)
        cerr << "ERROR: For Kr83m, put both energies as 9.4 or both as 32.1 "
                "keV please."
             << endl;
      return 1;
    }
  } else if (type_num == gammaRay && verbosity > 0) {
    if (eMin < 10. || eMax < 10.) {
      cerr << "WARNING: Typically beta model works better for ER BG at low "
              "energies as in a WS."
           << endl;
      cerr << "ER data is often best matched by a weighted average of the beta "
              "& gamma models."
           << endl;
    }
  }

  // Draw an event energy from the appropriate spectrum
  TestSpectra spec;
  double keV = -999.;
  if (eMin == eMax && eMin >= 0. && eMax > 0.)
    keV = eMin;
  else {
    switch (type_num) {
      case CH3T:
        keV = spec.CH3T_spectrum(eMin, eMax);
        break;
      case C14:
        keV = spec.C14_spectrum(eMin, eMax);
        break;
      case B8:  // normalize this to ~3500 / 10-ton / year, for E-threshold of
                // 0.5 keVnr, OR 180 evts/t/yr/keV at 1 keV
        keV = spec.B8_spectrum(eMin, eMax);
        break;
      case AmBe:  // for ZEPLIN-III FSR from HA (Pal '98)
        keV = spec.AmBe_spectrum(eMin, eMax);
        break;
      case Cf:
        keV = spec.Cf_spectrum(eMin, eMax);
        break;
      case DD:
        keV = spec.DD_spectrum(eMin, eMax, 10., 0.1, 60., 25., 0.);
        break;
      case WIMP:
        spec.wimp_spectrum_prep =
            spec.WIMP_prep_spectrum(wimp_mass_GeV, E_step, dayNum);
        keV =
            spec.WIMP_spectrum(spec.wimp_spectrum_prep, wimp_mass_GeV, dayNum);
        break;
      default:
        keV = eMin + (eMax - eMin) * RandomGen::rndm()->rand_uniform();
        break;
    }
  }

  // For most sources, ensure that the energy is in bounds
  if (type_num != WIMP && type_num != B8) {
    if (keV > eMax) keV = eMax;
    if (keV < eMin) keV = eMin;
  }

  // Calculate noble density based on temperature and pressure.
  // Use this to determine whether we are in gas phase
  double rho = n.SetDensity(detector->get_T_Kelvin(),
                            detector->get_p_bar());  // cout.precision(12);
  if (rho < 1.) detector->set_inGas(true);

  // Calculate and print g1, g2 parameters (once per detector)
  vector<double> g2_params = n.CalculateG2();
  g2 = g2_params.back();

  // Calculate a drift velocity table for non-uniform fields,
  // and calculate the drift velocity at detector center for normalization
  // purposes
  vTable = n.SetDriftVelocity_NonUniform(rho, z_step, detector->get_T_Kelvin(), detector->get_p_bar(), pos_x, pos_y);
  vD_middle = vTable[int(
      floor(.5 * (detector->get_gate() - 100. + detector->get_cathode() + 1.5) /
                z_step +
            0.5))];

  // Regenerate a random position for the event until the corresponding drift
  // time is within bounds (drift time uses the cumulative Z-dependent drift
  // velocity)
  driftTime = -999;
  while (driftTime < detector->get_dt_min() ||
         driftTime > detector->get_dt_max() || pos_z <= 0 ||
         pos_z > detector->get_TopDrift()) {
    pos_z = 0. +
            (detector->get_TopDrift() - 0.) * RandomGen::rndm()->rand_uniform();
    r = detector->get_radius() * sqrt(RandomGen::rndm()->rand_uniform());
    phi = 2. * M_PI * RandomGen::rndm()->rand_uniform();
    pos_x = r * cos(phi);
    pos_y = r * sin(phi);
    field = detector->FitEF(pos_x, pos_y, pos_z);
    index = int(floor(pos_z / z_step + 0.5));
    vD = vTable[index];
    driftTime =
        (detector->get_TopDrift() - pos_z) / vD;  // (mm - mm) / (mm / us) = us
  }

  // Get yields from NEST calculator, along with number of quanta
  yields =
      n.GetYields(type_num, keV, rho, field, double(massNum), double(atomNum),
                  default_NRYieldsParam, default_ERYieldsParam);
  quanta = n.GetQuanta(yields, rho, default_NRERWidthsParam, -999.);

  // Calculate S2 photons using electron lifetime correction
  double Nphd_S2 =
      g2 * quanta.electrons * exp(-driftTime / detector->get_eLife_us());

  // Vectors for saving times and amplitudes of waveforms (with
  // (S1/S2)CalculationMode set to "Waveform" and the verbosity >= 1 in
  // analysis.hh)
  vector<double> wf_amp;
  vector<int64_t> wf_time;

  double truthPos[3] = {pos_x, pos_y, pos_z};
  double smearPos[3] = {pos_x, pos_y, pos_z};

  // Calculate the S1 based on the quanta generated
  vector<double> scint =
      n.GetS1(quanta, truthPos[0], truthPos[1], truthPos[2], smearPos[0],
              smearPos[1], smearPos[2], vD, vD_middle, type_num, 0, field, keV,
              s1CalculationMode, verbosity, wf_time, wf_amp);

  // Take care of gamma-X case for positions below cathode
  if (truthPos[2] < detector->get_cathode()) quanta.electrons = 0;
  vector<double> scint2 =
      n.GetS2(quanta.electrons, truthPos[0], truthPos[1], truthPos[2],
              smearPos[0], smearPos[1], smearPos[2], driftTime, vD, 0, field,
              s2CalculationMode, verbosity, wf_time, wf_amp, g2_params);

  // If using the reconstructed energy, back-calculate energy as measured from
  // yields
  if (!MCtruthE) {
    double Nph, g1 = detector->get_g1(), Ne;
    if (usePD == 0)
      Nph = std::abs(scint[3]) / (g1 * (1. + detector->get_P_dphe()));
    else if (usePD == 1)
      Nph = std::abs(scint[5]) / g1;
    else
      Nph = std::abs(scint[7]) / g1;

    if (usePD == 0)
      Ne = std::abs(scint2[5]) / (g2 * (1. + detector->get_P_dphe()));
    else
      Ne = std::abs(scint2[7]) / g2;

    if (yields.Lindhard > DBL_MIN && Nph > 0. && Ne > 0.) {
      keV = (Nph + Ne) * W_DEFAULT * 1e-3 / yields.Lindhard;
    } else
      keV = 0.;
  }

  // Possible outputs from "scint" vector
  // scint[0] = nHits; // MC-true integer hits in same OR different PMTs, NO
  // double phe effect
  // scint[1] = Nphe; // MC-true integer hits WITH double phe effect (Nphe >
  // nHits)
  // scint[2] = pulseArea; // floating real# smeared DAQ pulse areas in phe, NO
  // XYZ correction
  // scint[3] = pulseAreaC; // smeared DAQ pulse areas in phe, WITH XYZ
  // correction
  // scint[4] = Nphd; // same as pulse area, adjusted/corrected *downward* for
  // 2-PE effect (LUX phd units)
  // scint[5] = NphdC; // same as Nphd, but XYZ-corrected
  // scint[6] = spike; // floating real# spike count, NO XYZ correction
  // scint[7] = spikeC; // floating real# spike count, WITH XYZ correction
  // scint[8] = fdetector->get_g1(); // g1 (light collection efficiency in
  // liquid)

  // Possible outputs from "scint2" vector
  // scint2[0] = Nee; // integer number of electrons unabsorbed in liquid then
  // getting extracted
  // scint2[1] = Nph; // raw number of photons produced in the gas gap
  // scint2[2] = nHits; // MC-true integer hits in same OR different PMTs, NO
  // double phe effect
  // scint2[3] = Nphe; // MC-true integer hits WITH double phe effect (Nphe >
  // nHits). S2 has more steps than S1 (e's 1st)
  //
  // If S2 threshold is set to positive (normal mode)
  // scint2[4] = pulseArea; // floating real# smeared DAQ pulse areas in phe, NO
  // XYZ correction
  // scint2[5] = pulseAreaC; // smeared DAQ pulse areas in phe, WITH XYZ
  // correction
  // scint2[6] = Nphd; // same as pulse area, adjusted/corrected *downward* for
  // 2-PE effect (LUX phd units)
  // scint2[7] = NphdC; // same as Nphd, but XYZ-corrected
  //
  // If S2 threshold is set to negative (switches from S2 -> S2 bottom, NOT
  // literally negative)
  // scint2[4] = S2b; // floating real# smeared pulse areas in phe ONLY
  // including bottom PMTs, NO XYZ correction
  // scint2[5] = S2bc; // floating real# smeared pulse areas in phe ONLY
  // including bottom PMTs, WITH XYZ correction
  // scint2[6] = S2b / (1.+fdetector->get_P_dphe()); // same as S2b, but
  // adjusted for 2-PE effect (LUX phd units)
  // scint2[7] = S2bc / (1.+fdetector->get_P_dphe()); // same as S2bc, but
  // adjusted for 2-PE effect (LUX phd units)
  // scint2[8] = g2; // g2 = ExtEff * SE, light collection efficiency of EL in
  // gas gap (from CalculateG2)

  // Print selected outputs a la execNEST
  fprintf(
      stdout,
      "\nE [keV]\t\tfield [V/cm]\ttDrift [us]\tX,Y,Z [mm]\tNph\tNe-\tS1 [PE "
      "or phe]\tS1_3Dcor [phd]\tS1c_spike\tNe-Extr\tS2_rawArea "
      "[PE]\tS2_3Dcorr [phd]\n");
  printf("%.6f\t%.6f\t%.6f\t%.0f, %.0f, %.0f\t%d\t%d\t", keV, field, driftTime,
         truthPos[0], truthPos[1], truthPos[2], quanta.photons,
         quanta.electrons);  // comment this out when below line in
  // If energy > 1 MeV, switch output notation
  if (keV > 1000. || scint[5] > maxS1 || scint2[7] > maxS2) {
    printf("%e\t%e\t%e\t", scint[2], scint[5], scint[7]);
    printf("%lli\t%e\t%e\n", (long long int)scint2[0], scint2[4], scint2[7]);
  } else {
    printf("%.6f\t%.6f\t%.6f\t", scint[2], scint[5],
           scint[7]);  // see GetS1 inside of NEST.cpp for full explanation of
                       // all 8 scint return vector elements. Sample 3 most
                       // common
    printf("%i\t%.6f\t%.6f\n", (int)scint2[0], scint2[4],
           scint2[7]);  // see GetS2 inside of NEST.cpp for full explanation of
                        // all 8 scint2 vector elements. Change as you desire
  }

  return 0;
}